

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O0

void __thiscall
pica::Grid<(pica::Dimension)3,_double>::Grid
          (Grid<(pica::Dimension)3,_double> *this,PositionType *origin,PositionType *step,
          IndexType *size)

{
  undefined8 uVar1;
  IndexType_conflict size_00;
  IndexType_conflict size_01;
  IndexType_conflict size_02;
  IndexType_conflict size_03;
  IndexType_conflict size_04;
  IndexType_conflict size_05;
  IndexType_conflict size_06;
  IndexType_conflict size_07;
  IndexType_conflict *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  Array3d<double> *in_RDI;
  Array3d<double> *this_00;
  undefined8 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffec0;
  
  size_00.z = in_stack_fffffffffffffec0;
  size_00._0_8_ = in_stack_fffffffffffffeb8;
  this_00 = in_RDI;
  Array3d<double>::Array3d(in_RDI,size_00,(double)in_RDI);
  size_01.z = in_stack_fffffffffffffec0;
  size_01.x = (int)in_stack_fffffffffffffeb8;
  size_01.y = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  Array3d<double>::Array3d(this_00,size_01,(double)in_RDI);
  size_02.z = in_stack_fffffffffffffec0;
  size_02.x = (int)in_stack_fffffffffffffeb8;
  size_02.y = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  Array3d<double>::Array3d(this_00,size_02,(double)in_RDI);
  size_03.z = in_stack_fffffffffffffec0;
  size_03.x = (int)in_stack_fffffffffffffeb8;
  size_03.y = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  Array3d<double>::Array3d(this_00,size_03,(double)in_RDI);
  size_04.z = in_stack_fffffffffffffec0;
  size_04.x = (int)in_stack_fffffffffffffeb8;
  size_04.y = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  Array3d<double>::Array3d(this_00,size_04,(double)in_RDI);
  size_05.z = in_stack_fffffffffffffec0;
  size_05.x = (int)in_stack_fffffffffffffeb8;
  size_05.y = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  Array3d<double>::Array3d(this_00,size_05,(double)in_RDI);
  size_06.z = in_stack_fffffffffffffec0;
  size_06.x = (int)in_stack_fffffffffffffeb8;
  size_06.y = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  Array3d<double>::Array3d(this_00,size_06,(double)in_RDI);
  size_07.z = in_stack_fffffffffffffec0;
  size_07.x = (int)in_stack_fffffffffffffeb8;
  size_07.y = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  Array3d<double>::Array3d(this_00,size_07,(double)in_RDI);
  Array3d<double>::Array3d(this_00,*in_RCX,(double)in_RDI);
  uVar1 = *in_RSI;
  in_RDI[9].size.x = (int)uVar1;
  in_RDI[9].size.y = (int)((ulong)uVar1 >> 0x20);
  *(undefined8 *)&in_RDI[9].size.z = in_RSI[1];
  in_RDI[9].data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_RSI[2];
  in_RDI[9].data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)*in_RDX;
  in_RDI[9].data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_RDX[1];
  uVar1 = in_RDX[2];
  in_RDI[10].size.x = (int)uVar1;
  in_RDI[10].size.y = (int)((ulong)uVar1 >> 0x20);
  return;
}

Assistant:

Grid(const PositionType& origin, const PositionType& step, const IndexType& size) :
        exData(size),
        eyData(size),
        ezData(size),
        bxData(size),
        byData(size),
        bzData(size),
        jxData(size),
        jyData(size),
        jzData(size),
        origin(origin),
        step(step) {}